

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O0

void fiobj_ary_set(FIOBJ ary,FIOBJ obj,int64_t pos)

{
  size_t sVar1;
  FIOBJ local_28;
  FIOBJ old;
  int64_t pos_local;
  FIOBJ obj_local;
  FIOBJ ary_local;
  
  old = pos;
  pos_local = obj;
  obj_local = ary;
  if (ary != 0) {
    sVar1 = fiobj_type_is(ary,FIOBJ_T_ARRAY);
    if (sVar1 != 0) {
      local_28 = 0;
      fio_ary___set((fio_ary___s *)(obj_local + 8),old,pos_local,&local_28);
      fiobj_free(local_28);
      return;
    }
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0x8c,"void fiobj_ary_set(FIOBJ, FIOBJ, int64_t)");
}

Assistant:

void fiobj_ary_set(FIOBJ ary, FIOBJ obj, int64_t pos) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  FIOBJ old = FIOBJ_INVALID;
  fio_ary___set(&obj2ary(ary)->ary, pos, obj, &old);
  fiobj_free(old);
}